

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_prepare_for_events(libj1939_cmn *cmn,int *nfds,_Bool dont_wait)

{
  FILE *__stream;
  int iVar1;
  ulong uVar2;
  int *piVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  uint __errnum;
  timespec tStack_38;
  
  uVar2 = 0;
  if ((int)CONCAT71(in_register_00000011,dont_wait) == 0) {
    clock_gettime(1,&tStack_38);
    uVar2 = timespec_diff_ms(&cmn->next_send_time,(timespec *)&tStack_38);
    if ((long)uVar2 < 0) {
      uVar2 = 0;
    }
    else if (uVar2 >> 0x1f != 0) {
      fprintf(_stderr,"timeout too long: %ld ms",uVar2);
      uVar2 = 0x7fffffff;
    }
  }
  iVar1 = epoll_wait(cmn->epoll_fd,(epoll_event *)cmn->epoll_events,(int)cmn->epoll_events_size,
                     (int)uVar2);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (iVar1 != 4) {
      *nfds = 0;
      return -iVar1;
    }
    iVar1 = -4;
  }
  *nfds = iVar1;
  iVar1 = clock_gettime(1,(timespec *)&cmn->last_time);
  __errnum = 0;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar3;
    pcVar4 = strerror(__errnum);
    fprintf(__stream,"failed to get time: %i (%s)",(ulong)__errnum,pcVar4);
  }
  return __errnum;
}

Assistant:

int libj1939_prepare_for_events(struct libj1939_cmn *cmn, int *nfds,
				bool dont_wait)
{
	int ret, timeout_ms;

	if (dont_wait)
		timeout_ms = 0;
	else
		timeout_ms = libj1939_get_timeout_ms(&cmn->next_send_time);

	ret = epoll_wait(cmn->epoll_fd, cmn->epoll_events,
			 cmn->epoll_events_size, timeout_ms);
	if (ret < 0) {
		ret = -errno;
		if (ret != -EINTR) {
			*nfds = 0;
			return ret;
		}
	}

	*nfds = ret;

	ret = clock_gettime(CLOCK_MONOTONIC, &cmn->last_time);
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to get time: %i (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}